

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaUtil.cpp
# Opt level: O1

void __thiscall MatrixProperties::computemuBI(MatrixProperties *this)

{
  size_type i;
  element_type *peVar1;
  pointer pdVar2;
  MatrixProperties *pMVar3;
  size_type sVar4;
  reference pdVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  size_type j;
  size_type j_00;
  size_type i_00;
  double dVar9;
  double dVar10;
  undefined8 uVar11;
  allocator_type local_b1;
  size_type local_b0;
  unbounded_array<double,_std::allocator<double>_> *local_a8;
  MatrixProperties *local_a0;
  ulong local_98;
  double local_90;
  size_type local_88;
  size_type local_80;
  double local_78;
  undefined8 uStack_70;
  ulong local_68;
  long local_60;
  double local_58;
  undefined8 uStack_50;
  vector<double,_std::allocator<double>_> local_48;
  
  peVar1 = (this->matrix).
           super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_b0 = peVar1->size1_;
  std::vector<double,_std::allocator<double>_>::vector(&local_48,peVar1->size1_ + 1,&local_b1);
  pdVar2 = (this->BI).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->BI).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->BI).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->BI).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a0 = this;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_a0->muBI = 0.0;
  if (0 < (int)(uint)local_b0) {
    local_a8 = &peVar1->data_;
    local_68 = (ulong)((uint)local_b0 & 0x7fffffff);
    local_80 = 0xffffffffffffffff;
    local_88 = 1;
    local_98 = 0;
    do {
      local_90 = 0.0;
      lVar7 = 1;
      do {
        i_00 = local_98 - lVar7;
        i = lVar7 + local_98;
        lVar8 = 3;
        j = local_80;
        j_00 = local_88;
        local_60 = lVar7;
        do {
          dVar10 = 0.0;
          uVar11 = 0;
          if (-1 < (long)i_00) {
            if (-1 < (long)j) {
              sVar4 = boost::numeric::ublas::basic_row_major<unsigned_long,_long>::element
                                (i_00,peVar1->size1_,j,peVar1->size2_);
              pdVar5 = boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::
                       operator[](local_a8,sVar4);
              dVar10 = *pdVar5;
            }
            uVar11 = 0;
            if ((int)j_00 < (int)(uint)local_b0) {
              uStack_70 = 0;
              local_78 = dVar10;
              sVar4 = boost::numeric::ublas::basic_row_major<unsigned_long,_long>::element
                                (i_00,peVar1->size1_,j_00,peVar1->size2_);
              pdVar5 = boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::
                       operator[](local_a8,sVar4);
              dVar10 = local_78 - *pdVar5;
              uVar11 = uStack_70;
            }
          }
          dVar9 = 0.0;
          if ((int)i < (int)(uint)local_b0) {
            local_78 = dVar10;
            uStack_70 = uVar11;
            if (-1 < (long)j) {
              sVar4 = boost::numeric::ublas::basic_row_major<unsigned_long,_long>::element
                                (i,peVar1->size1_,j,peVar1->size2_);
              pdVar5 = boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::
                       operator[](local_a8,sVar4);
              dVar9 = *pdVar5;
            }
            dVar10 = local_78;
            if ((int)j_00 < (int)(uint)local_b0) {
              uStack_50 = 0;
              local_58 = dVar9;
              sVar4 = boost::numeric::ublas::basic_row_major<unsigned_long,_long>::element
                                (i,peVar1->size1_,j_00,peVar1->size2_);
              pdVar5 = boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::
                       operator[](local_a8,sVar4);
              dVar9 = local_58 - *pdVar5;
              dVar10 = local_78;
            }
          }
          local_90 = local_90 + ABS(dVar9) + ABS(dVar10);
          j = j - 1;
          j_00 = j_00 + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
        lVar7 = local_60 + 1;
      } while (lVar7 != 0xd);
      (local_a0->BI).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[local_98] = local_90;
      local_a0->muBI = local_90 + local_a0->muBI;
      local_98 = local_98 + 1;
      local_80 = local_80 + 1;
      local_88 = local_88 + 1;
    } while (local_98 != local_68);
  }
  pMVar3 = local_a0;
  local_a0->muBI = local_a0->muBI / (double)(int)(uint)local_b0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Mean Boundary Index is ",0x17);
  poVar6 = std::ostream::_M_insert<double>(pMVar3->muBI);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  return;
}

Assistant:

void MatrixProperties::computemuBI() {
    using namespace boost::range;
    // A reference will be easier to work with here
    SparseMatrix& M = *matrix;
    int n = matrix->size1();
    BI = std::vector<double>(matrix->size1()+1);

    double interval = 3;
    double steps = 12;
    double b = 0, a1, a2;
    muBI = 0;
    for (int i=0; i<n; i++) {
        b = 0;
        for (int q=1; q<=steps; q++) {
            for (int p=1; p<=interval; p++){
                a1 = 0;
                a2 = 0;
                if (i-q >= 0) {
                    if (i-p >= 0)
                        a1 = M(i-q, i-p);
                    if (i+p < n)
                        a1 -= M(i-q, i+p);
                }
                if (i+q < n) {
                    if (i-p >= 0)
                        a2 = M(i+q, i-p);
                    if (i+p < n)
                        a2 -= M(i+q, i+p);
                }
                b += abs(a1) + abs(a2);
            }
        }
        BI[i] = b;
        muBI += b;
    }
    muBI /= n;
    cerr << "Mean Boundary Index is " << muBI << endl;
}